

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::ReadMetadata(XmlSerializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  MetaEntry entry;
  string value;
  string asStack_88 [8];
  long local_80;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  string local_28 [32];
  
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::meta_name_abi_cxx11_);
  std::__cxx11::string::string
            (asStack_88,(char *)CONCAT44(extraout_var,iVar1),(allocator *)local_68);
  (*this->xmlReader->_vptr_IIrrXMLReader[2])();
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[0xe])();
  std::__cxx11::string::string
            (local_28,(char *)CONCAT44(extraout_var_00,iVar1),(allocator *)local_68);
  if (local_80 != 0) {
    local_68._0_8_ = local_68 + 0x10;
    local_68._8_8_ = 0;
    local_68[0x10] = '\0';
    local_48._M_p = (pointer)&local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)local_68);
    std::__cxx11::string::_M_assign((string *)&local_48);
    std::
    vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
    ::push_back(&this->mMetaData,(value_type *)local_68);
    MetaEntry::~MetaEntry((MetaEntry *)local_68);
  }
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(asStack_88);
  return;
}

Assistant:

void ReadMetadata() {
        const std::string name = xmlReader->getAttributeValue( D3MF::XmlTag::meta_name.c_str() );
        xmlReader->read();
        const std::string value = xmlReader->getNodeData();

        if ( name.empty() ) {
            return;
        }

        MetaEntry entry;
        entry.name = name;
        entry.value = value;
        mMetaData.push_back( entry );
    }